

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int CVodeSetLSNormFactor(void *cvode_mem,sunrealtype nrmfac)

{
  long lVar1;
  double in_XMM0_Qa;
  double dVar2;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined4 local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffb8,(CVLsMem *)0x11fc1a);
  if (local_4 == 0) {
    if (in_XMM0_Qa <= 0.0) {
      if (0.0 <= in_XMM0_Qa) {
        lVar1 = N_VGetLength(*(undefined8 *)(local_28 + 0x60));
        if (0.0 < (double)lVar1) {
          lVar1 = N_VGetLength(*(undefined8 *)(local_28 + 0x60));
          dVar2 = sqrt((double)lVar1);
        }
        else {
          dVar2 = 0.0;
        }
        *(double *)(local_28 + 0x40) = dVar2;
      }
      else {
        N_VConst(0x3ff0000000000000,*(undefined8 *)(local_28 + 0x60));
        dVar2 = (double)N_VDotProd(*(undefined8 *)(local_28 + 0x60),*(undefined8 *)(local_28 + 0x60)
                                  );
        if (0.0 < dVar2) {
          dVar2 = (double)N_VDotProd(*(undefined8 *)(local_28 + 0x60),
                                     *(undefined8 *)(local_28 + 0x60));
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = 0.0;
        }
        *(double *)(local_28 + 0x40) = dVar2;
      }
    }
    else {
      *(double *)(local_28 + 0x40) = in_XMM0_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetLSNormFactor(void* cvode_mem, sunrealtype nrmfac)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  if (nrmfac > ZERO)
  {
    /* user-provided factor */
    cvls_mem->nrmfac = nrmfac;
  }
  else if (nrmfac < ZERO)
  {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, cvls_mem->ytemp);
    cvls_mem->nrmfac = SUNRsqrt(N_VDotProd(cvls_mem->ytemp, cvls_mem->ytemp));
  }
  else
  {
    /* compute default factor for WRMS norm from vector length */
    cvls_mem->nrmfac = SUNRsqrt(N_VGetLength(cvls_mem->ytemp));
  }

  return (CVLS_SUCCESS);
}